

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLowering.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::StringLowering::replaceInstructions::Replacer::create(Replacer *this)

{
  _func_int **local_20;
  
  std::
  make_unique<wasm::StringLowering::replaceInstructions(wasm::Module*)::Replacer,wasm::StringLowering&>
            ((StringLowering *)&stack0xffffffffffffffe0);
  *(_func_int ***)this = local_20;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<Replacer>(lowering);
      }